

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

bool __thiscall duckdb_shell::ShellState::OpenDatabase(ShellState *this,char **azArg,idx_t nArg)

{
  string *this_00;
  uint8_t uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (safe_mode == '\x01') {
    fwrite(".open cannot be used in -safe mode\n",0x23,1,_stderr);
    bVar5 = false;
  }
  else {
    close_db(this->db);
    this->db = (sqlite3 *)0x0;
    globalDb = (sqlite3 *)0x0;
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    this_00 = &this->zDbFilename;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar1 = '\0';
    this->openMode = '\0';
    uVar4 = this->openFlags & 0xfeffffff;
    this->openFlags = uVar4;
    this->szMax = 0;
    bVar5 = false;
    for (uVar6 = 1; (uVar6 < nArg && (pcVar3 = azArg[uVar6], *pcVar3 == '-')); uVar6 = uVar6 + 1) {
      iVar2 = optionMatch(pcVar3,"new");
      if (iVar2 == 0) {
        iVar2 = optionMatch(pcVar3,"readonly");
        if (iVar2 == 0) {
          iVar2 = optionMatch(pcVar3,"nofollow");
          if (iVar2 == 0) {
            fprintf(_stderr,"unknown option: %s\n",pcVar3);
            return false;
          }
          uVar4 = uVar4 | 0x1000000;
          this->openFlags = uVar4;
        }
        else {
          this->openMode = '\x04';
          uVar1 = '\x04';
        }
      }
      else {
        bVar5 = true;
      }
    }
    if (nArg < 2) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = duckdb_shell_sqlite3_mprintf("%s",azArg[1]);
      uVar1 = this->openMode;
    }
    if ((pcVar3 != (char *)0x0) || (uVar1 == '\x06')) {
      if (bVar5) {
        unlink(pcVar3);
      }
      std::__cxx11::string::assign((char *)this_00);
      duckdb_shell_sqlite3_free(pcVar3);
      OpenDB(this,1);
      if (this->db != (sqlite3 *)0x0) {
        return true;
      }
      fprintf(_stderr,"Error: cannot open \'%s\'\n",pcVar3);
    }
    bVar5 = true;
    if (this->db == (sqlite3 *)0x0) {
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      OpenDB(this,0);
    }
  }
  return bVar5;
}

Assistant:

bool ShellState::OpenDatabase(const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".open cannot be used in -safe mode\n");
		return false;
	}
	char *zNewFilename;   /* Name of the database file to open */
	idx_t iName = 1;      /* Index in azArg[] of the filename */
	bool newFlag = false; /* True to delete file before opening */
	/* Close the existing database */
	close_db(db);
	db = nullptr;
	globalDb = nullptr;
	zDbFilename = string();
	openMode = SHELL_OPEN_UNSPEC;
	openFlags = openFlags & ~(SQLITE_OPEN_NOFOLLOW); // don't overwrite settings loaded in the command line
	szMax = 0;
	/* Check for command-line arguments */
	for (idx_t iName = 1; iName < nArg && azArg[iName][0] == '-'; iName++) {
		const char *z = azArg[iName];
		if (optionMatch(z, "new")) {
			newFlag = true;
		} else if (optionMatch(z, "readonly")) {
			openMode = SHELL_OPEN_READONLY;
		} else if (optionMatch(z, "nofollow")) {
			openFlags |= SQLITE_OPEN_NOFOLLOW;
		} else if (z[0] == '-') {
			utf8_printf(stderr, "unknown option: %s\n", z);
			return false;
		}
	}
	/* If a filename is specified, try to open it first */
	zNewFilename = nArg > iName ? sqlite3_mprintf("%s", azArg[iName]) : 0;
	if (zNewFilename || openMode == SHELL_OPEN_HEXDB) {
		if (newFlag) {
			shellDeleteFile(zNewFilename);
		}
		zDbFilename = zNewFilename;
		sqlite3_free(zNewFilename);
		OpenDB(OPEN_DB_KEEPALIVE);
		if (!db) {
			utf8_printf(stderr, "Error: cannot open '%s'\n", zNewFilename);
		}
	}
	if (!db) {
		/* As a fall-back open a TEMP database */
		zDbFilename = string();
		OpenDB(0);
	}
	return true;
}